

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

RegExp * __thiscall re2c::Scanner::mkDot(Scanner *this)

{
  bool bVar1;
  opt_t *poVar2;
  Range *pRVar3;
  RegExp *pRVar4;
  Range *inv;
  Range *ran;
  Range *pRStack_18;
  uint32_t c;
  Range *full;
  Scanner *this_local;
  
  full = (Range *)this;
  poVar2 = Opt::operator->((Opt *)&opts);
  pRStack_18 = Enc::fullRange(&poVar2->encoding);
  ran._4_4_ = 10;
  poVar2 = Opt::operator->((Opt *)&opts);
  bVar1 = Enc::encode(&poVar2->encoding,(uint32_t *)((long)&ran + 4));
  if (!bVar1) {
    fatalf(this,"Bad code point: \'0x%X\'",(ulong)ran._4_4_);
  }
  pRVar3 = Range::sym(ran._4_4_);
  pRVar3 = Range::sub(pRStack_18,pRVar3);
  pRVar4 = cls(this,pRVar3);
  return pRVar4;
}

Assistant:

RegExp * Scanner::mkDot() const
{
	Range * full = opts->encoding.fullRange();
	uint32_t c = '\n';
	if (!opts->encoding.encode(c))
		fatalf("Bad code point: '0x%X'", c);
	Range * ran = Range::sym (c);
	Range * inv = Range::sub (full, ran);

	return cls(inv);
}